

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Linear_Object_State_PDU
          (Linear_Object_State_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  Linear_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header,H);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Linear_Object_State_PDU_0032d210;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID);
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp);
  std::
  vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ::vector(&this->m_vSegments);
  (*(this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Linear_Object_State_PDU::Linear_Object_State_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Object_State_Header( H )
{
    Decode( stream, true );
}